

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O2

int stk_uint_compare(void *p1,void *p2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*p2 <= *p1) {
    uVar1 = (uint)(*p2 < *p1);
  }
  return uVar1;
}

Assistant:

static inline int stk_uint_compare(const void *p1, const void *p2)
{
    const unsigned pp1 = *(const unsigned *)p1;
    const unsigned pp2 = *(const unsigned *)p2;

    if (pp1 < pp2)
        return -1;
    if (pp1 > pp2)
        return 1;
    return 0;
}